

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmEvalChunk(jx9_vm *pVm,jx9_context *pCtx,SyString *pChunk,int iFlags,int bTrueReturn)

{
  sxi32 sVar1;
  undefined1 local_a8 [8];
  jx9_value sResult;
  void *pErrData;
  ProcConsumer xErr;
  SySet aByteCode;
  SySet *pByteCode;
  int bTrueReturn_local;
  int iFlags_local;
  SyString *pChunk_local;
  jx9_context *pCtx_local;
  jx9_vm *pVm_local;
  
  pErrData = (void *)0x0;
  sResult.nIdx = 0;
  sResult._60_4_ = 0;
  SySetInit((SySet *)&xErr,&pVm->sAllocator,0x18);
  SySetAlloc((SySet *)&xErr,0x20);
  if (bTrueReturn != 0) {
    pErrData = (pVm->pEngine->xConf).xErr;
    sResult._56_8_ = (pVm->pEngine->xConf).pErrData;
  }
  jx9ResetCodeGenerator(pVm,(ProcConsumer)pErrData,(void *)sResult._56_8_);
  aByteCode.pUserData = pVm->pByteContainer;
  pVm->pByteContainer = (SySet *)&xErr;
  jx9CompileScript(pVm,pChunk,iFlags);
  if ((pVm->sCodeGen).nErr == 0) {
    sVar1 = jx9VmEmitInstr(pVm,1,0,0,(void *)0x0,(sxu32 *)0x0);
    if (sVar1 == 0) {
      if (bTrueReturn == 0) {
        jx9MemObjInit(pVm,(jx9_value *)local_a8);
      }
      else {
        jx9MemObjInitFromBool(pVm,(jx9_value *)local_a8,1);
      }
      VmLocalExec(pVm,(SySet *)&xErr,(jx9_value *)local_a8);
      if (pCtx != (jx9_context *)0x0) {
        jx9_result_value(pCtx,(jx9_value *)local_a8);
      }
      jx9MemObjRelease((jx9_value *)local_a8);
    }
    else if (pCtx != (jx9_context *)0x0) {
      jx9_result_bool(pCtx,0);
    }
  }
  else if (pCtx != (jx9_context *)0x0) {
    jx9_result_bool(pCtx,0);
  }
  pVm->pByteContainer = (SySet *)aByteCode.pUserData;
  SySetRelease((SySet *)&xErr);
  return 0;
}

Assistant:

static sxi32 VmEvalChunk(
	jx9_vm *pVm,        /* Underlying Virtual Machine */
	jx9_context *pCtx,  /* Call Context */
	SyString *pChunk,   /* JX9 chunk to evaluate */ 
	int iFlags,         /* Compile flag */
	int bTrueReturn     /* TRUE to return execution result */
	)
{
	SySet *pByteCode, aByteCode;
	ProcConsumer xErr = 0;
	void *pErrData = 0;
	/* Initialize bytecode container */
	SySetInit(&aByteCode, &pVm->sAllocator, sizeof(VmInstr));
	SySetAlloc(&aByteCode, 0x20);
	/* Reset the code generator */
	if( bTrueReturn ){
		/* Included file, log compile-time errors */
		xErr = pVm->pEngine->xConf.xErr;
		pErrData = pVm->pEngine->xConf.pErrData;
	}
	jx9ResetCodeGenerator(pVm, xErr, pErrData);
	/* Swap bytecode container */
	pByteCode = pVm->pByteContainer;
	pVm->pByteContainer = &aByteCode;
	/* Compile the chunk */
	jx9CompileScript(pVm, pChunk, iFlags);
	if( pVm->sCodeGen.nErr > 0 ){
		/* Compilation error, return false */
		if( pCtx ){
			jx9_result_bool(pCtx, 0);
		}
	}else{
		jx9_value sResult; /* Return value */
		if( SXRET_OK != jx9VmEmitInstr(pVm, JX9_OP_DONE, 0, 0, 0, 0) ){
			/* Out of memory */
			if( pCtx ){
				jx9_result_bool(pCtx, 0);
			}
			goto Cleanup;
		}
		if( bTrueReturn ){
			/* Assume a boolean true return value */
			jx9MemObjInitFromBool(pVm, &sResult, 1);
		}else{
			/* Assume a null return value */
			jx9MemObjInit(pVm, &sResult);
		}
		/* Execute the compiled chunk */
		VmLocalExec(pVm, &aByteCode, &sResult);
		if( pCtx ){
			/* Set the execution result */
			jx9_result_value(pCtx, &sResult);
		}
		jx9MemObjRelease(&sResult);
	}
Cleanup:
	/* Cleanup the mess left behind */
	pVm->pByteContainer = pByteCode;
	SySetRelease(&aByteCode);
	return SXRET_OK;
}